

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  cmMakefileTargetGenerator *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  string *psVar2;
  string copyEcho;
  string copyCommand;
  string output;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string macdir;
  
  bVar1 = cmTarget::IsBundleOnApple(this->Generator->Target);
  if (bVar1) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              (&macdir,this->Generator->OSXBundleGenerator,pkgloc);
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    std::__cxx11::string::string((string *)&input,(string *)psVar2);
    std::__cxx11::string::string((string *)&output,(string *)&macdir);
    std::__cxx11::string::append((char *)&output);
    cmsys::SystemTools::GetFilenameName(&copyEcho,&input);
    std::__cxx11::string::append((string *)&output);
    std::__cxx11::string::~string((string *)&copyEcho);
    this_00 = this->Generator;
    Convert(&copyEcho,this_00,&output,START_OUTPUT,UNCHANGED);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this_00->CleanFiles,&copyEcho);
    std::__cxx11::string::~string((string *)&copyEcho);
    Convert(&copyEcho,this->Generator,&output,HOME_OUTPUT,UNCHANGED);
    std::__cxx11::string::operator=((string *)&output,(string *)&copyEcho);
    std::__cxx11::string::~string((string *)&copyEcho);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&input);
    std::__cxx11::string::string
              ((string *)&copyEcho,"Copying OS X content ",(allocator *)&copyCommand);
    std::__cxx11::string::append((string *)&copyEcho);
    this_01 = this->Generator->LocalGenerator;
    std::__cxx11::string::string
              ((string *)&copyCommand,copyEcho._M_dataplus._M_p,(allocator *)&local_b8);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (this_01,&commands,&copyCommand,EchoBuild,(EchoProgress *)0x0);
    std::__cxx11::string::~string((string *)&copyCommand);
    std::__cxx11::string::string
              ((string *)&copyCommand,"$(CMAKE_COMMAND) -E copy ",(allocator *)&local_b8);
    Convert(&local_b8,this->Generator,&input,NONE,SHELL);
    std::__cxx11::string::append((string *)&copyCommand);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::append((char *)&copyCommand);
    Convert(&local_b8,this->Generator,&output,NONE,SHELL);
    std::__cxx11::string::append((string *)&copyCommand);
    std::__cxx11::string::~string((string *)&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&commands,&copyCommand);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->Generator->LocalGenerator,(ostream *)this->Generator->BuildFileStream,
               (char *)0x0,&output,&depends,&commands,false,false);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Generator->ExtraFiles,&output);
    std::__cxx11::string::~string((string *)&copyCommand);
    std::__cxx11::string::~string((string *)&copyEcho);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::~string((string *)&macdir);
  }
  return;
}

Assistant:

void
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
  (cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if(!this->Generator->GetTarget()->IsBundleOnApple())
    {
    return;
    }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  this->Generator->CleanFiles.push_back(
    this->Generator->Convert(output,
                             cmLocalGenerator::START_OUTPUT));
  output = this->Generator->Convert(output,
                                    cmLocalGenerator::HOME_OUTPUT);

  // Create a rule to copy the content into the bundle.
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  depends.push_back(input);
  std::string copyEcho = "Copying OS X content ";
  copyEcho += output;
  this->Generator->LocalGenerator->AppendEcho(
    commands, copyEcho.c_str(),
    cmLocalUnixMakefileGenerator3::EchoBuild);
  std::string copyCommand = "$(CMAKE_COMMAND) -E copy ";
  copyCommand += this->Generator->Convert(input,
                                          cmLocalGenerator::NONE,
                                          cmLocalGenerator::SHELL);
  copyCommand += " ";
  copyCommand += this->Generator->Convert(output,
                                          cmLocalGenerator::NONE,
                                          cmLocalGenerator::SHELL);
  commands.push_back(copyCommand);
  this->Generator->LocalGenerator->WriteMakeRule(
    *this->Generator->BuildFileStream, 0,
    output,
    depends, commands, false);
  this->Generator->ExtraFiles.insert(output);
}